

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_array.hpp
# Opt level: O1

void __thiscall
sisl::sparse_array_n<float,_2,_std::allocator<float>_>::sparse_array_n
          (sparse_array_n<float,_2,_std::allocator<float>_> *this,float *dv,uint d0,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list vl;
  _Hashtable<int,_std::pair<const_int,_float>,_std::allocator<std::pair<const_int,_float>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_f8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined4 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  undefined8 local_18;
  
  if (in_AL != '\0') {
    local_88 = in_XMM0_Da;
    local_78 = in_XMM1_Qa;
    local_68 = in_XMM2_Qa;
    local_58 = in_XMM3_Qa;
    local_48 = in_XMM4_Qa;
    local_38 = in_XMM5_Qa;
    local_28 = in_XMM6_Qa;
    local_18 = in_XMM7_Qa;
  }
  (this->super_array_n<float,_2,_std::allocator<float>_>)._array = (float *)0x0;
  (this->super_array_n<float,_2,_std::allocator<float>_>)._dims[0] = 0;
  (this->super_array_n<float,_2,_std::allocator<float>_>)._dims[1] = 0;
  (this->siteMap)._M_h._M_buckets = &(this->siteMap)._M_h._M_single_bucket;
  (this->siteMap)._M_h._M_bucket_count = 1;
  (this->siteMap)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->siteMap)._M_h._M_element_count = 0;
  (this->siteMap)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->siteMap)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->siteMap)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->defaultValue = *dv;
  this->_dims[0] = d0;
  this->_dims[1] = (uint)local_a0;
  local_f8._M_buckets = &local_f8._M_single_bucket;
  local_f8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_f8._M_element_count = 0;
  local_f8._M_bucket_count = 1;
  local_f8._M_rehash_policy._M_max_load_factor = 1.0;
  local_f8._M_rehash_policy._4_4_ = 0;
  local_f8._M_rehash_policy._M_next_resize = 0;
  local_f8._M_single_bucket = (__node_base_ptr)0x0;
  local_a0 = in_RCX;
  local_98 = in_R8;
  local_90 = in_R9;
  std::
  _Hashtable<int,_std::pair<const_int,_float>,_std::allocator<std::pair<const_int,_float>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_M_move_assign(&(this->siteMap)._M_h,&local_f8);
  std::
  _Hashtable<int,_std::pair<const_int,_float>,_std::allocator<std::pair<const_int,_float>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_f8);
  return;
}

Assistant:

sparse_array_n(const T &dv, unsigned int d0, ...) : defaultValue(dv) {
            unsigned int n = d0;

            // Start with d0
            va_list vl;
            va_start(vl, d0);

            _dims[0] = d0;

            for(int i = 1; i < N; i++) {
                _dims[i] = va_arg(vl, unsigned int);
                n *= _dims[i];
            }
            va_end(vl);
            siteMap = std::unordered_map<int, T>();
        }